

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O1

CordRep * __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeNavigator::
Init<(absl::lts_20240722::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtreeNavigator *this,CordRepBtree *tree)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xae,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  if ((tree->super_CordRep).storage[2] == (tree->super_CordRep).storage[1]) {
    __assert_fail("tree->size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xaf,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  bVar1 = (tree->super_CordRep).storage[0];
  uVar5 = (ulong)bVar1;
  if (0xb < bVar1) {
    __assert_fail("tree->height() <= CordRepBtree::kMaxHeight",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xb0,
                  "CordRep *absl::cord_internal::CordRepBtreeNavigator::Init(CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  this->height_ = (uint)bVar1;
  bVar4 = (tree->super_CordRep).storage[1];
  this->node_[uVar5] = tree;
  this->index_[uVar5] = bVar4;
  uVar3 = (ulong)bVar4;
  if (uVar5 != 0) {
    lVar6 = (ulong)bVar1 + 1;
    do {
      if (bVar4 < (tree->super_CordRep).storage[1]) goto LAB_0011289b;
      if ((tree->super_CordRep).storage[2] <= bVar4) goto LAB_001128ba;
      tree = (CordRepBtree *)tree->edges_[uVar3];
      if ((tree->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      *(CordRepBtree **)(this->index_ + lVar6 * 8 + -4) = tree;
      bVar4 = (tree->super_CordRep).storage[1];
      this->index_[lVar6 + -2] = bVar4;
      uVar3 = (ulong)bVar4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  pCVar2 = this->node_[0];
  if ((pCVar2->super_CordRep).storage[1] <= bVar4) {
    if (bVar4 < (pCVar2->super_CordRep).storage[2]) {
      return pCVar2->edges_[uVar3];
    }
LAB_001128ba:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
LAB_0011289b:
  __assert_fail("index >= begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
}

Assistant:

inline CordRep* CordRepBtreeNavigator::Init(CordRepBtree* tree) {
  assert(tree != nullptr);
  assert(tree->size() > 0);
  assert(tree->height() <= CordRepBtree::kMaxHeight);
  int height = height_ = tree->height();
  size_t index = tree->index(edge_type);
  node_[height] = tree;
  index_[height] = static_cast<uint8_t>(index);
  while (--height >= 0) {
    tree = tree->Edge(index)->btree();
    node_[height] = tree;
    index = tree->index(edge_type);
    index_[height] = static_cast<uint8_t>(index);
  }
  return node_[0]->Edge(index);
}